

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlmvn.cc
# Opt level: O0

void __thiscall klogic::mlmvn::dump_errors(mlmvn *this)

{
  size_t sVar1;
  const_reference this_00;
  size_type sVar2;
  ostream *poVar3;
  complex *pcVar4;
  int local_24;
  int k;
  cvector *layer_errs;
  int layer;
  mlmvn *this_local;
  
  layer_errs._4_4_ = 0;
  while( true ) {
    sVar1 = layers_count(this);
    if (sVar1 <= (ulong)(long)layer_errs._4_4_) break;
    this_00 = std::
              vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
              ::operator[](&this->errors,(long)layer_errs._4_4_);
    local_24 = 0;
    while( true ) {
      sVar2 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size
                        (this_00);
      if (sVar2 <= (ulong)(long)local_24) break;
      poVar3 = std::operator<<((ostream *)&std::cerr,"Delta[");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_24 + 1);
      poVar3 = std::operator<<(poVar3,',');
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,layer_errs._4_4_ + 1);
      poVar3 = std::operator<<(poVar3,"] = ");
      pcVar4 = (complex *)
               std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                         (this_00,(long)local_24);
      poVar3 = std::operator<<(poVar3,pcVar4);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      local_24 = local_24 + 1;
    }
    layer_errs._4_4_ = layer_errs._4_4_ + 1;
  }
  return;
}

Assistant:

void klogic::mlmvn::dump_errors() const
{
    for (int layer = 0; layer < layers_count(); ++layer) {
        const cvector &layer_errs = errors[layer];

        for (int k = 0; k < layer_errs.size(); ++k) {
            std::cerr << "Delta[" << (k+1) << ',' << (layer+1) << "] = " << layer_errs[k] << std::endl;
        }
    }
}